

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void cmGlobalNinjaGenerator::WriteRule(ostream *os,cmNinjaRule *rule)

{
  ulong uVar1;
  ostream *poVar2;
  allocator<char> local_1d1;
  string local_1d0;
  anon_class_8_1_3fcf66a2 local_1b0;
  anon_class_8_1_3fcf66a2 writeKV;
  cmAlphaNum local_178;
  string local_148;
  cmAlphaNum local_128;
  cmAlphaNum local_f8;
  string local_c8;
  cmAlphaNum local_98;
  cmAlphaNum local_68;
  string local_38;
  cmNinjaRule *local_18;
  cmNinjaRule *rule_local;
  ostream *os_local;
  
  local_18 = rule;
  rule_local = (cmNinjaRule *)os;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) == 0) {
      uVar1 = std::__cxx11::string::empty();
      if (((uVar1 & 1) == 0) && (uVar1 = std::__cxx11::string::empty(), (uVar1 & 1) != 0)) {
        cmAlphaNum::cmAlphaNum
                  (&local_178,
                   "rspfile but no rspfile_content given for WriteRule! called with comment: ");
        cmAlphaNum::cmAlphaNum((cmAlphaNum *)&writeKV,&local_18->Comment);
        cmStrCat<>(&local_148,&local_178,(cmAlphaNum *)&writeKV);
        cmSystemTools::Error(&local_148);
        std::__cxx11::string::~string((string *)&local_148);
      }
      else {
        WriteComment((ostream *)rule_local,&local_18->Comment);
        poVar2 = std::operator<<((ostream *)rule_local,"rule ");
        poVar2 = std::operator<<(poVar2,(string *)local_18);
        std::operator<<(poVar2,'\n');
        local_1b0.os = (ostream *)rule_local;
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"depfile",&local_18->DepFile);
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"deps",&local_18->DepType);
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"command",&local_18->Command);
        WriteRule::anon_class_8_1_3fcf66a2::operator()
                  (&local_1b0,"description",&local_18->Description);
        uVar1 = std::__cxx11::string::empty();
        if ((uVar1 & 1) == 0) {
          WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"rspfile",&local_18->RspFile);
          WriteRule::anon_class_8_1_3fcf66a2::operator()
                    (&local_1b0,"rspfile_content",&local_18->RspContent);
        }
        WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"restat",&local_18->Restat);
        if ((local_18->Generator & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,"1",&local_1d1);
          WriteRule::anon_class_8_1_3fcf66a2::operator()(&local_1b0,"generator",&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::allocator<char>::~allocator(&local_1d1);
        }
        std::operator<<((ostream *)rule_local,'\n');
      }
    }
    else {
      cmAlphaNum::cmAlphaNum(&local_f8,"No command given for WriteRule! called with comment: ");
      cmAlphaNum::cmAlphaNum(&local_128,&local_18->Comment);
      cmStrCat<>(&local_c8,&local_f8,&local_128);
      cmSystemTools::Error(&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
  }
  else {
    cmAlphaNum::cmAlphaNum(&local_68,"No name given for WriteRule! called with comment: ");
    cmAlphaNum::cmAlphaNum(&local_98,&local_18->Comment);
    cmStrCat<>(&local_38,&local_68,&local_98);
    cmSystemTools::Error(&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteRule(std::ostream& os,
                                       cmNinjaRule const& rule)
{
  // -- Parameter checks
  // Make sure the rule has a name.
  if (rule.Name.empty()) {
    cmSystemTools::Error(cmStrCat(
      "No name given for WriteRule! called with comment: ", rule.Comment));
    return;
  }

  // Make sure a command is given.
  if (rule.Command.empty()) {
    cmSystemTools::Error(cmStrCat(
      "No command given for WriteRule! called with comment: ", rule.Comment));
    return;
  }

  // Make sure response file content is given
  if (!rule.RspFile.empty() && rule.RspContent.empty()) {
    cmSystemTools::Error(
      cmStrCat("rspfile but no rspfile_content given for WriteRule! "
               "called with comment: ",
               rule.Comment));
    return;
  }

  // -- Write rule
  // Write rule intro
  cmGlobalNinjaGenerator::WriteComment(os, rule.Comment);
  os << "rule " << rule.Name << '\n';

  // Write rule key/value pairs
  auto writeKV = [&os](const char* key, std::string const& value) {
    if (!value.empty()) {
      cmGlobalNinjaGenerator::Indent(os, 1);
      os << key << " = " << value << '\n';
    }
  };

  writeKV("depfile", rule.DepFile);
  writeKV("deps", rule.DepType);
  writeKV("command", rule.Command);
  writeKV("description", rule.Description);
  if (!rule.RspFile.empty()) {
    writeKV("rspfile", rule.RspFile);
    writeKV("rspfile_content", rule.RspContent);
  }
  writeKV("restat", rule.Restat);
  if (rule.Generator) {
    writeKV("generator", "1");
  }

  // Finish rule
  os << '\n';
}